

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_hmc_multiple_val.cpp
# Opt level: O2

double calc_action(double *x,double (*A) [3])

{
  double dVar1;
  int idim;
  long lVar2;
  double (*padVar3) [3];
  int jdim;
  long lVar4;
  double dVar5;
  
  dVar5 = 0.0;
  padVar3 = A;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    dVar1 = x[lVar2];
    for (lVar4 = 0; lVar2 != lVar4; lVar4 = lVar4 + 1) {
      dVar5 = dVar5 + (*padVar3)[lVar4] * dVar1 * x[lVar4];
    }
    dVar5 = dVar5 + dVar1 * 0.5 * *(double *)(lVar2 * 0x20 + (long)A) * dVar1;
    padVar3 = padVar3 + 1;
  }
  return dVar5;
}

Assistant:

double calc_action(const double x[ndim], const double A[ndim][ndim]) {
    double action = 0e0;
    for (int idim = 0; idim < ndim; idim++) {
        for (int jdim = 0; jdim < idim; jdim++) {
            action += x[idim] * A[idim][jdim] * x[jdim];
        }
        action += 0.5e0 * x[idim] * A[idim][idim] * x[idim];
    }
    return action;
}